

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_TakeStep_Z(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  N_Vector z;
  realtype *prVar1;
  int iVar2;
  int iVar3;
  N_Vector *pp_Var4;
  byte bVar5;
  ulong uVar6;
  double dVar7;
  int nvec;
  uint local_74;
  realtype *local_70;
  int *local_68;
  N_Vector *local_60;
  realtype *local_58;
  ARKodeMem ark_mem;
  N_Vector *local_48;
  N_Vector *local_40;
  ARKodeARKStepMem step_mem;
  
  iVar2 = arkStep_AccessStepMem(arkode_mem,"arkStep_TakeStep_Z",&ark_mem,&step_mem);
  if (iVar2 != 0) {
    return iVar2;
  }
  local_58 = step_mem->cvals;
  local_60 = step_mem->Xvecs;
  if ((step_mem->implicit == 0) && (step_mem->mass_type == 0)) {
    *nflagPtr = 0;
  }
  local_70 = dsmPtr;
  if ((step_mem->NLS != (SUNNonlinearSolver)0x0) &&
     (step_mem->NLS->ops->setup != (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0)) {
    z = ark_mem->tempv3;
    N_VConst(0.0,z);
    iVar2 = SUNNonlinSolSetup(step_mem->NLS,z,ark_mem);
    if (iVar2 < 0) {
      return -0x1e;
    }
    if (iVar2 != 0) {
      return -0x1f;
    }
  }
  local_48 = &ark_mem->tempv1;
  local_40 = &step_mem->zcor;
  uVar6 = 0;
  local_68 = nflagPtr;
  while( true ) {
    prVar1 = local_70;
    if ((long)step_mem->stages <= (long)uVar6) {
      if (step_mem->mass_type == 1) {
        iVar2 = arkStep_ComputeSolutions_MassFixed(ark_mem,local_70);
      }
      else {
        iVar2 = arkStep_ComputeSolutions(ark_mem,local_70);
      }
      if (-1 < iVar2) {
        if (iVar2 == 0) {
          iVar2 = 0;
          if (ark_mem->report != 0) {
            fprintf((FILE *)ark_mem->diagfp,"ARKStep  etest  %li  %.16g  %.16g\n",ark_mem->h,*prVar1
                    ,ark_mem->nst);
          }
        }
        else {
          *nflagPtr = iVar2;
          iVar2 = 5;
        }
      }
      return iVar2;
    }
    step_mem->istage = (int)uVar6;
    iVar2 = step_mem->implicit;
    dVar7 = (&step_mem->Be)[iVar2 != 0]->c[uVar6] * ark_mem->h + ark_mem->tn;
    ark_mem->tcur = dVar7;
    if ((step_mem->mass_type == 2) && (step_mem->msetup != (ARKMassSetupFn)0x0)) {
      iVar2 = (*step_mem->msetup)(ark_mem,dVar7,ark_mem->tempv1,ark_mem->tempv2,ark_mem->tempv3);
      if (iVar2 != 0) {
        return -0xf;
      }
      iVar2 = step_mem->implicit;
    }
    if (iVar2 == 0) {
      iVar2 = 0;
      bVar5 = 0;
    }
    else {
      iVar2 = 0;
      bVar5 = 0;
      if (1e-10 < ABS(step_mem->Bi->A[uVar6][uVar6])) {
        iVar2 = arkStep_Predict(ark_mem,(int)uVar6,step_mem->zpred);
        if (iVar2 != 0) {
          return iVar2;
        }
        bVar5 = 1;
        if (step_mem->stage_predict == (ARKStagePredictFn)0x0) {
          iVar2 = 1;
        }
        else {
          iVar3 = (*step_mem->stage_predict)(ark_mem->tcur,step_mem->zpred,ark_mem->user_data);
          if (iVar3 < 0) {
            return -0x27;
          }
          iVar2 = 1;
          if (iVar3 != 0) {
            return 5;
          }
        }
      }
    }
    iVar2 = arkStep_StageSetup(ark_mem,iVar2);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (ark_mem->report != 0) {
      fprintf((FILE *)ark_mem->diagfp,"ARKStep  step  %li  %.16g  %i  %.16g\n",ark_mem->h,
              ark_mem->tcur,ark_mem->nst,uVar6 & 0xffffffff);
    }
    if (bVar5 == 0) {
      if (step_mem->mass_type == 1) {
        iVar2 = (*step_mem->msolve)(ark_mem,step_mem->sdata,step_mem->nlscoef);
        *nflagPtr = iVar2;
        if (iVar2 != 0) {
          return 5;
        }
      }
      N_VLinearSum(1.0,ark_mem->yn,1.0,step_mem->sdata,ark_mem->ycur);
    }
    else {
      iVar2 = arkStep_Nls(ark_mem,*nflagPtr);
      *nflagPtr = iVar2;
      if (iVar2 != 0) {
        return 5;
      }
    }
    if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
       (iVar2 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data), iVar2 != 0
       )) break;
    if (step_mem->implicit != 0) {
      bVar5 = bVar5 & step_mem->deduce_rhs != 0;
      if (bVar5 == 1) {
        pp_Var4 = local_40;
        if ((step_mem->mass_type == 1) &&
           (iVar2 = (*step_mem->mmult)(ark_mem,step_mem->zcor,ark_mem->tempv1), pp_Var4 = local_48,
           iVar2 != 0)) {
          return -0x12;
        }
        N_VLinearSum(1.0 / step_mem->gamma,*pp_Var4,-1.0 / step_mem->gamma,step_mem->sdata,
                     step_mem->Fi[uVar6]);
      }
      else {
        iVar2 = (*step_mem->fi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fi[uVar6],ark_mem->user_data);
        step_mem->nfi = step_mem->nfi + 1;
        if (iVar2 < 0) {
          return -8;
        }
        if (iVar2 != 0) {
          return -0xb;
        }
      }
      prVar1 = local_58;
      pp_Var4 = local_60;
      local_74 = (uint)bVar5;
      if (step_mem->impforcing != 0) {
        *local_58 = 1.0;
        *local_60 = step_mem->Fi[uVar6];
        nvec = 1;
        arkStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&nvec);
        nflagPtr = local_68;
        N_VLinearCombination(nvec,prVar1,pp_Var4,step_mem->Fi[uVar6]);
      }
    }
    if (step_mem->explicit != 0) {
      iVar2 = (*step_mem->fe)(step_mem->Be->c[uVar6] * ark_mem->h + ark_mem->tn,ark_mem->ycur,
                              step_mem->Fe[uVar6],ark_mem->user_data);
      prVar1 = local_58;
      pp_Var4 = local_60;
      step_mem->nfe = step_mem->nfe + 1;
      if (iVar2 < 0) {
        return -8;
      }
      if (iVar2 != 0) {
        return -0xb;
      }
      if (step_mem->expforcing != 0) {
        *local_58 = 1.0;
        *local_60 = step_mem->Fe[uVar6];
        nvec = 1;
        arkStep_ApplyForcing(step_mem,step_mem->Be->c[uVar6] * ark_mem->h + ark_mem->tn,1.0,&nvec);
        nflagPtr = local_68;
        N_VLinearCombination(nvec,prVar1,pp_Var4,step_mem->Fe[uVar6]);
      }
    }
    if (step_mem->mass_type == 2) {
      if ((step_mem->implicit != 0) && (local_74 == 0)) {
        iVar2 = (*step_mem->msolve)(ark_mem,step_mem->Fi[uVar6],step_mem->nlscoef);
        *nflagPtr = iVar2;
        if (iVar2 != 0) {
          return 5;
        }
      }
      if (step_mem->explicit != 0) {
        iVar2 = (*step_mem->msolve)(ark_mem,step_mem->Fe[uVar6],step_mem->nlscoef);
        *nflagPtr = iVar2;
        if (iVar2 != 0) {
          return 5;
        }
      }
    }
    uVar6 = uVar6 + 1;
  }
  return -0x26;
}

Assistant:

int arkStep_TakeStep_Z(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  int retval, is, nvec;
  booleantype implicit_stage;
  booleantype deduce_stage;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  N_Vector zcor0;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_TakeStep_Z",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if problem will involve no algebraic solvers, initialize nflagPtr to success */
  if ((!step_mem->implicit) && (step_mem->mass_type == MASS_IDENTITY))
    *nflagPtr = ARK_SUCCESS;

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
    if ((step_mem->NLS)->ops->setup) {
      zcor0 = ark_mem->tempv3;
      N_VConst(ZERO, zcor0);    /* set guess to all 0 (since using predictor-corrector form) */
      retval = SUNNonlinSolSetup(step_mem->NLS, zcor0, ark_mem);
      if (retval < 0) return(ARK_NLS_SETUP_FAIL);
      if (retval > 0) return(ARK_NLS_SETUP_RECVR);
    }

  /* loop over internal stages to the step */
  for (is=0; is<step_mem->stages; is++) {

    /* store current stage index */
    step_mem->istage = is;

    /* set current stage time(s) */
    if (step_mem->implicit)
      ark_mem->tcur = ark_mem->tn + step_mem->Bi->c[is]*ark_mem->h;
    else
      ark_mem->tcur = ark_mem->tn + step_mem->Be->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ARKStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* setup time-dependent mass matrix */
    if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL)) {
      retval = step_mem->msetup((void *) ark_mem, ark_mem->tcur,
                                ark_mem->tempv1, ark_mem->tempv2,
                                ark_mem->tempv3);
      if (retval != ARK_SUCCESS)  return(ARK_MASSSETUP_FAIL);
    }

    /* determine whether implicit solve is required */
    implicit_stage = SUNFALSE;
    if (step_mem->implicit)
      if (SUNRabs(step_mem->Bi->A[is][is]) > TINY)
        implicit_stage = SUNTRUE;

#ifdef SUNDIALS_DEBUG
    if (implicit_stage)
      printf("implicit stage\n");
    else
      printf("explicit stage\n");
#endif

    /* if implicit, call built-in and user-supplied predictors
       (results placed in zpred) */
    if (implicit_stage) {

      retval = arkStep_Predict(ark_mem, is, step_mem->zpred);
      if (retval != ARK_SUCCESS)  return (retval);

      /* if a user-supplied predictor routine is provided, call that here.
         Note that arkStep_Predict is *still* called, so this user-supplied
         routine can just 'clean up' the built-in prediction, if desired. */
      if (step_mem->stage_predict) {
        retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                         ark_mem->user_data);
        if (retval < 0)  return(ARK_USER_PREDICT_FAIL);
        if (retval > 0)  return(TRY_AGAIN);
      }

    }

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep predictor:\n");
    N_VPrint(step_mem->zpred);
#endif

    /* set up explicit data for evaluation of ARK stage (store in sdata) */
    retval = arkStep_StageSetup(ark_mem, implicit_stage);
    if (retval != ARK_SUCCESS)  return (retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep rhs data:\n");
    N_VPrint(step_mem->sdata);
#endif

    /* solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "ARKStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::arkStep_TakeStep_Z", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* perform implicit solve if required */
    if (implicit_stage) {

      /* implicit solve result is stored in ark_mem->ycur;
         return with positive value on anything but success */
      *nflagPtr = arkStep_Nls(ark_mem, *nflagPtr);
      if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep implicit stage %i solution:\n",is);
      N_VPrint(ark_mem->ycur);
#endif

    /* otherwise no implicit solve is needed */
    } else {

      /* if M is fixed, solve with it to compute update (place back in sdata) */
      if (step_mem->mass_type == MASS_FIXED) {

        /* perform solve; return with positive value on anything but success */
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->sdata,
                                     step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

      }

      /* set y to be yn + sdata (either computed in arkStep_StageSetup,
         or updated in prev. block) */
      N_VLinearSum(ONE, ark_mem->yn, ONE, step_mem->sdata, ark_mem->ycur);

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep explicit stage %i solution:\n",is);
      N_VPrint(ark_mem->ycur);
#endif

    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    /* NOTE: with internally inconsistent IMEX methods (c_i^E != c_i^I) the value
       of tcur corresponds to the stage time from the implicit table (c_i^I). */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* successful stage solve */
    /*    store implicit RHS (value in Fi[is] is from preceding nonlinear iteration) */
    if (step_mem->implicit) {
      deduce_stage = step_mem->deduce_rhs && implicit_stage;

      if (!deduce_stage) {
        retval = step_mem->fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[is], ark_mem->user_data);
        step_mem->nfi++;
      } else if (step_mem->mass_type == MASS_FIXED)  {
        retval = step_mem->mmult((void *) ark_mem, step_mem->zcor, ark_mem->tempv1);
        if (retval != ARK_SUCCESS)  return (ARK_MASSMULT_FAIL);
        N_VLinearSum(ONE / step_mem->gamma, ark_mem->tempv1,
                     -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
      } else {
        N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                     -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
      }

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep implicit stage RHS Fi[%i]:\n",is);
      N_VPrint(step_mem->Fi[is]);
#endif

      if (retval < 0)  return(ARK_RHSFUNC_FAIL);
      if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fi[is];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[is]);
      }
    }

    /*    store explicit RHS */
    if (step_mem->explicit) {
        retval = step_mem->fe(ark_mem->tn + step_mem->Be->c[is]*ark_mem->h,
                              ark_mem->ycur, step_mem->Fe[is], ark_mem->user_data);
        step_mem->nfe++;

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    ARKStep explicit stage RHS Fe[%i]:\n",is);
        N_VPrint(step_mem->Fe[is]);
#endif

        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);
        /* apply external polynomial forcing */
        if (step_mem->expforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fe[is];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, ark_mem->tn+step_mem->Be->c[is]*ark_mem->h,
                               ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[is]);
        }
    }

    /* if using a time-dependent mass matrix, update Fe[is] and/or Fi[is] with M(t)^{-1} */
    if (step_mem->mass_type == MASS_TIMEDEP) {
      /* If the implicit stage was deduced, it already includes M(t)^{-1} */
      if (step_mem->implicit && !deduce_stage) {
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->Fi[is], step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);
      }
      if (step_mem->explicit) {
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->Fe[is], step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);
      }
    }

  } /* loop over stages */

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm).
     This can fail recoverably due to nonconvergence of the mass matrix solve,
     so handle that appropriately. */
  if (step_mem->mass_type == MASS_FIXED) {
    retval = arkStep_ComputeSolutions_MassFixed(ark_mem, dsmPtr);
  } else {
    retval = arkStep_ComputeSolutions(ark_mem, dsmPtr);
  }
  if (retval < 0)  return(retval);
  if (retval > 0) {
    *nflagPtr = retval;
    return(TRY_AGAIN);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep updated solution:\n");
    N_VPrint(ark_mem->ycur);
#endif

#ifdef SUNDIALS_DEBUG
  printf("    ARKStep error estimate = %"RSYM"\n", *dsmPtr);
#endif

  /* solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ARKStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkStep_TakeStep_Z", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}